

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbutil.c
# Opt level: O3

int nga_test_internal(Integer *nbhandle)

{
  ga_nbhdl_array_t *pgVar1;
  struct_armcihdl_t *psVar2;
  ga_armcihdl_t *nb_handle;
  uint uVar3;
  uint uVar4;
  int iVar5;
  struct_armcihdl_t *psVar6;
  struct_armcihdl_t *psVar7;
  gai_nbhdl_t *inbhandle;
  
  uVar3 = (uint)*nbhandle & 0xff;
  uVar4 = 0;
  if ((uint)*nbhandle >> 8 == ga_ihdl_array[uVar3].ga_nbtag) {
    pgVar1 = ga_ihdl_array + uVar3;
    psVar2 = pgVar1->ahandle;
    while (nb_handle = psVar2, nb_handle != (ga_armcihdl_t *)0x0) {
      iVar5 = ARMCI_Test(&nb_handle->handle);
      psVar2 = nb_handle->next;
      if (iVar5 == 0) {
        psVar6 = nb_handle->previous;
        if (psVar6 == (struct_armcihdl_t *)0x0) {
          pgVar1->ahandle = psVar2;
          if (psVar2 != (struct_armcihdl_t *)0x0) {
            psVar6 = (struct_armcihdl_t *)0x0;
            psVar7 = psVar2;
            goto LAB_0019a57e;
          }
        }
        else {
          psVar6->next = psVar2;
          psVar7 = nb_handle->next;
          if (psVar7 != (struct_armcihdl_t *)0x0) {
LAB_0019a57e:
            psVar7->previous = psVar6;
          }
        }
        nb_handle->active = 0;
        nb_handle->next = (struct_armcihdl_t *)0x0;
        nb_handle->previous = (struct_armcihdl_t *)0x0;
        ga_ihdl_array[uVar3].count = ga_ihdl_array[uVar3].count + -1;
      }
    }
    iVar5 = ga_ihdl_array[uVar3].count;
    if (iVar5 == 0) {
      pgVar1->ahandle = (ga_armcihdl_t *)0x0;
      ga_ihdl_array[uVar3].active = 0;
    }
    uVar4 = (uint)(0 < iVar5);
  }
  return uVar4;
}

Assistant:

int nga_test_internal(Integer *nbhandle)
{
  gai_nbhdl_t *inbhandle = (gai_nbhdl_t *)nbhandle;
  int index = inbhandle->ihdl_index;
  int retval = 0;
  int tag = inbhandle->ga_nbtag;

  /* check if tags match. If they don't then this request was already completed
   * so the handle can be used for another GA non-blocking call. Just return in
   * this case */
  if (tag == ga_ihdl_array[index].ga_nbtag) {
    ga_armcihdl_t* next = ga_ihdl_array[index].ahandle;
    /* Loop over linked list and test all remaining armci non-blocking calls */
    while(next) {
      int ret = ARMCI_Test(&next->handle);
      ga_armcihdl_t *tmp = next->next;
      if (ret == 0) {
        /* operation is completed so remove it from linked list */
        if (next->previous != NULL) {
          /* operation is not first element in list */
          next->previous->next = next->next;
          if (next->next != NULL) {
            next->next->previous = next->previous;
          }
        } else {
          /* operation is first element in list */
          ga_ihdl_array[index].ahandle = next->next;
          if (next->next != NULL) {
            next->next->previous = NULL;
          }
        }
        next->previous = NULL;
        next->next = NULL;
        next->active = 0;
        ga_ihdl_array[index].count--;
      }
      next = tmp;
    }
    if (ga_ihdl_array[index].count == 0) {
      ga_ihdl_array[index].ahandle = NULL;
      ga_ihdl_array[index].active = 0;
    }
    if (ga_ihdl_array[index].count > 0) retval = 1;
  }

  return(retval);
}